

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger table_filter(HSQUIRRELVM v)

{
  SQTable *x;
  SQRESULT SVar1;
  SQInteger nitr;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr itr;
  SQObjectPtr ret;
  SQTable *tbl;
  SQObject *o;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  SQSharedState *in_stack_ffffffffffffff50;
  SQTable *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  SQObjectPtr *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  SQTable *in_stack_ffffffffffffff88;
  SQInteger in_stack_ffffffffffffff90;
  SQObjectValue in_stack_ffffffffffffff98;
  SQObjectPtr local_60 [2];
  SQObjectPtr local_40;
  SQObjectPtr local_30;
  SQObjectValue local_20;
  SQObject *local_18;
  SQInteger local_8;
  
  local_18 = &stack_get((HSQUIRRELVM)in_stack_ffffffffffffff50,
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))->
              super_SQObject;
  local_20 = local_18->_unVal;
  x = SQTable::Create(in_stack_ffffffffffffff50,
                      CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  SQObjectPtr::SQObjectPtr(&local_30,x);
  SQObjectPtr::SQObjectPtr(&local_40);
  SQObjectPtr::SQObjectPtr(local_60);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff90);
  do {
    in_stack_ffffffffffffff68 =
         (SQTable *)
         SQTable::Next(in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87,
                       in_stack_ffffffffffffff78,
                       (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (SQObjectPtr *)in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff68 == (SQTable *)0xffffffffffffffff) {
      SQVM::Push((SQVM *)in_stack_ffffffffffffff50,
                 (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      local_8 = 1;
LAB_0013b84b:
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
      return local_8;
    }
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffff68;
    SQObjectPtr::operator=
              ((SQObjectPtr *)in_stack_ffffffffffffff50,
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff78,local_18);
    SQVM::Push((SQVM *)in_stack_ffffffffffffff50,
               (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
    SQVM::Push((SQVM *)in_stack_ffffffffffffff50,
               (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    SQVM::Push((SQVM *)in_stack_ffffffffffffff50,
               (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    SVar1 = sq_call((HSQUIRRELVM)in_stack_ffffffffffffff98.pTable,in_stack_ffffffffffffff90,
                    (SQBool)in_stack_ffffffffffffff88,
                    CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    if (SVar1 < 0) {
      local_8 = -1;
      goto LAB_0013b84b;
    }
    in_stack_ffffffffffffff50 =
         (SQSharedState *)
         SQVM::GetUp((SQVM *)in_stack_ffffffffffffff50,
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff4f = SQVM::IsFalse((SQObjectPtr *)in_stack_ffffffffffffff50);
    if (!(bool)in_stack_ffffffffffffff4f) {
      SQTable::NewSlot(in_stack_ffffffffffffff88,
                       (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    }
    SQVM::Pop((SQVM *)0x13b819);
  } while( true );
}

Assistant:

static SQInteger table_filter(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQTable *tbl = _table(o);
    SQObjectPtr ret = SQTable::Create(_ss(v),0);

    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = tbl->Next(false, itr, key, val)) != -1) {
        itr = (SQInteger)nitr;

        v->Push(o);
        v->Push(key);
        v->Push(val);
        if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
            return SQ_ERROR;
        }
        if(!SQVM::IsFalse(v->GetUp(-1))) {
            _table(ret)->NewSlot(key, val);
        }
        v->Pop();
    }

    v->Push(ret);
    return 1;
}